

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainCache.cpp
# Opt level: O0

bool parseParameters(int argc,char **argv)

{
  int i;
  char **argv_local;
  int argc_local;
  
  i = 1;
  do {
    if (argc <= i) {
      return traceFilePath != (char *)0x0;
    }
    if (*argv[i] == '-') {
      if (argv[i][1] == 's') {
        isSingleStep = true;
      }
      else {
        if (argv[i][1] != 'v') {
          return false;
        }
        verbose = true;
      }
    }
    else {
      if (traceFilePath != (char *)0x0) {
        return false;
      }
      traceFilePath = argv[i];
    }
    i = i + 1;
  } while( true );
}

Assistant:

bool parseParameters(int argc, char **argv) {
  // Read Parameters
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '-') {
      switch (argv[i][1]) {
      case 'v':
        verbose = 1;
        break;
      case 's':
        isSingleStep = 1;
        break;
      default:
        return false;
      }
    } else {
      if (traceFilePath == nullptr) {
        traceFilePath = argv[i];
      } else {
        return false;
      }
    }
  }
  if (traceFilePath == nullptr) {
    return false;
  }
  return true;
}